

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__ptr;
  char *filename_00;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  ulong uVar11;
  char *pcVar12;
  undefined8 uVar13;
  long *plVar14;
  undefined8 *puVar15;
  char *nslist;
  stat buf_1;
  char buf [500];
  char prefix [500];
  char *local_4e0;
  int local_4d8;
  int local_4d4;
  char *local_4d0;
  char *local_4c8;
  int local_4bc;
  stat64 local_4b8;
  char local_428 [499];
  undefined1 local_235;
  undefined1 local_228 [504];
  
  local_4d8 = mode;
  local_4d4 = with_comments;
  pcVar3 = baseFilename(filename);
  sVar4 = strlen(pcVar3);
  sVar4 = (size_t)((int)sVar4 + -4);
  memcpy(local_228,pcVar3,sVar4);
  local_228[sVar4] = 0;
  iVar1 = snprintf(local_428,499,"result/c14n/%s/%s",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  pcVar3 = strdup(local_428);
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.xpath",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  __ptr = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    __ptr = strdup(local_428);
  }
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.ns",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  filename_00 = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    filename_00 = strdup(local_428);
  }
  nb_tests = nb_tests + 1;
  local_4b8.st_dev = 0;
  local_4e0 = (char *)0x0;
  lVar5 = xmlReadFile(filename,0,0x4a);
  if (lVar5 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
  }
  else {
    lVar6 = xmlDocGetRootElement(lVar5);
    if (lVar6 != 0) {
      local_4c8 = filename;
      if (__ptr != (char *)0x0) {
        lVar6 = xmlReadFile(__ptr,0,10);
        if (lVar6 == 0) {
          lVar7 = 0;
          fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
        }
        else {
          lVar7 = xmlDocGetRootElement(lVar6);
          if (lVar7 == 0) {
            lVar7 = 0;
            fprintf(_stderr,"Error: empty document for file \"%s\"\n",__ptr);
            xmlFreeDoc(lVar6);
          }
          else {
            for (lVar7 = *(long *)(lVar6 + 0x18); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x30)) {
              iVar1 = xmlStrEqual(*(undefined8 *)(lVar7 + 0x10),"XPath");
              if (iVar1 != 0) {
                lVar8 = xmlNodeGetContent(lVar7);
                if (lVar8 == 0) {
                  pcVar12 = "Error: XPath content element is NULL \"%s\"\n";
                  goto LAB_0010eec1;
                }
                lVar9 = xmlXPathNewContext(lVar5);
                if (lVar9 == 0) {
                  c14nCommonTest_cold_3();
                  goto LAB_0010eeff;
                }
                plVar14 = (long *)(lVar7 + 0x60);
                goto LAB_0010eb46;
              }
            }
            pcVar12 = "Error: XPath element expected in the file  \"%s\"\n";
LAB_0010eec1:
            lVar7 = 0;
            fprintf(_stderr,pcVar12,__ptr);
            xmlFreeDoc(lVar6);
          }
        }
        goto LAB_0010ebbc;
      }
      lVar7 = 0;
      goto LAB_0010ebd1;
    }
    fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
    xmlFreeDoc(lVar5);
  }
  goto LAB_0010ee62;
  while (iVar1 = xmlXPathRegisterNs(lVar9,plVar14[3],plVar14[2]), iVar1 == 0) {
LAB_0010eb46:
    plVar14 = (long *)*plVar14;
    if (plVar14 == (long *)0x0) {
      lVar7 = xmlXPathEvalExpression(lVar8,lVar9);
      if (lVar7 == 0) {
        c14nCommonTest_cold_2();
        goto LAB_0010eeff;
      }
      (*_xmlFree)(lVar8);
      xmlXPathFreeContext(lVar9);
      xmlFreeDoc(lVar6);
      goto LAB_0010ebbc;
    }
  }
  c14nCommonTest_cold_1();
LAB_0010eeff:
  lVar7 = 0;
LAB_0010ebbc:
  if (lVar7 != 0) {
LAB_0010ebd1:
    if (filename_00 == (char *)0x0) {
      puVar10 = (undefined8 *)0x0;
    }
    else {
      iVar1 = loadMem(filename_00,&local_4e0,&local_4bc);
      pcVar12 = local_4e0;
      if (iVar1 != 0) {
        c14nCommonTest_cold_5();
        goto LAB_0010ee62;
      }
      if (local_4e0 == (char *)0x0) {
        puVar10 = (undefined8 *)0x0;
      }
      else {
        iVar1 = xmlStrlen(local_4e0);
        if ((*pcVar12 == '\'') && (pcVar12[(long)iVar1 + -1] == '\'')) {
          pcVar12[(long)iVar1 + -1] = '\0';
          pcVar12 = pcVar12 + 1;
        }
        puVar10 = (undefined8 *)(*_xmlMalloc)(8000);
        if (puVar10 == (undefined8 *)0x0) {
          perror("malloc failed");
          puVar10 = (undefined8 *)0x0;
        }
        else {
          puVar15 = puVar10;
          local_4d0 = pcVar3;
          if (*pcVar12 != '\0') {
            iVar1 = 1000;
            do {
              uVar11 = (long)puVar15 - (long)puVar10;
              if ((long)(iVar1 + -10) < (long)uVar11 >> 3) {
                iVar1 = iVar1 * 2;
                puVar10 = (undefined8 *)(*_xmlRealloc)(puVar10,(long)iVar1 << 3);
                if (puVar10 == (undefined8 *)0x0) {
                  perror("realloc failed");
                  puVar10 = (undefined8 *)0x0;
                  pcVar3 = local_4d0;
                  goto LAB_0010ecfe;
                }
                puVar15 = puVar10 + (int)(uVar11 >> 3);
              }
              *puVar15 = pcVar12;
              puVar15 = puVar15 + 1;
              for (; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
                if (*pcVar12 == ',') {
                  *pcVar12 = '\0';
                  pcVar12 = pcVar12 + 1;
                  break;
                }
              }
            } while (*pcVar12 != '\0');
          }
          *puVar15 = 0;
          pcVar3 = local_4d0;
        }
      }
    }
LAB_0010ecfe:
    if (lVar7 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(undefined8 *)(lVar7 + 8);
    }
    size = xmlC14NDocDumpMemory(lVar5,uVar13,local_4d8,puVar10,local_4d4,&local_4b8);
    if ((int)size < 0) {
      fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",local_4c8,
              (ulong)size);
LAB_0010eea6:
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (((char *)local_4b8.st_dev != (char *)0x0) &&
         (iVar2 = compareFileMem(pcVar3,(char *)local_4b8.st_dev,size), iVar1 = 0, iVar2 != 0)) {
        c14nCommonTest_cold_6();
        goto LAB_0010eea6;
      }
    }
    if ((char *)local_4b8.st_dev != (char *)0x0) {
      (*_xmlFree)();
    }
    if (lVar7 != 0) {
      xmlXPathFreeObject(lVar7);
    }
    if (puVar10 != (undefined8 *)0x0) {
      (*_xmlFree)(puVar10);
    }
    if (local_4e0 != (char *)0x0) {
      free(local_4e0);
    }
    xmlFreeDoc(lVar5);
    goto LAB_0010ed96;
  }
  c14nCommonTest_cold_4();
LAB_0010ee62:
  iVar1 = 1;
LAB_0010ed96:
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (filename_00 != (char *)0x0) {
    free(filename_00);
  }
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}